

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
 __thiscall spvtools::opt::analysis::BoolConstant::Copy(BoolConstant *this)

{
  long in_RSI;
  _func_int **local_28;
  Bool *local_20;
  
  local_20 = (Bool *)(**(code **)(**(long **)(in_RSI + 8) + 0x40))();
  MakeUnique<spvtools::opt::analysis::BoolConstant,spvtools::opt::analysis::Bool_const*,bool_const&>
            ((spvtools *)&local_28,&local_20,(bool *)(in_RSI + 0x28));
  (this->super_ScalarConstant).super_Constant._vptr_Constant = local_28;
  return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Constant> Copy() const override {
    return std::unique_ptr<Constant>(CopyBoolConstant().release());
  }